

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  size_type sVar1;
  cmLocalGenerator *lg;
  element_type *peVar2;
  bool bVar3;
  string *psVar4;
  cmGeneratorTarget *this_00;
  uint uVar5;
  undefined7 in_register_00000009;
  byte bVar6;
  cmAlphaNum *b;
  allocator<char> local_135;
  undefined4 local_134;
  string err;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  anon_class_16_2_c95d1c49 print_err;
  undefined1 local_e8 [48];
  cmListFileBacktrace lfbt;
  string prop;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  string local_50 [32];
  
  local_134 = (undefined4)CONCAT71(in_register_00000009,ignoreMissingTarget);
  err._M_dataplus._M_p = (pointer)(genVars->GenNameUpper)._M_len;
  err._M_string_length = (size_type)(genVars->GenNameUpper)._M_str;
  b = (cmAlphaNum *)local_e8;
  local_e8._0_8_ = &DAT_0000000b;
  local_e8._8_8_ = "_EXECUTABLE";
  print_err.this = this;
  print_err.genVars = genVars;
  cmStrCat<>(&prop,(cmAlphaNum *)&err,b);
  psVar4 = cmTarget::GetSafeProperty(this->GenTarget->Target,&prop);
  sVar1 = psVar4->_M_string_length;
  if (sVar1 != 0) {
    cmMakefile::GetBacktrace((cmMakefile *)&lfbt);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_60,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&lfbt);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__cxx11::string::string(local_50,(string *)psVar4);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    std::__cxx11::string::~string(local_50);
    lg = this->LocalGen;
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"",&local_135);
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8[0x10] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,lg,&err,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,(string *)b);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&err);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if ((genVars->Executable)._M_string_length == 0 && (char)local_134 == '\0') {
      std::operator+(&err,&prop," evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&err);
      std::__cxx11::string::~string((string *)&err);
      b = (cmAlphaNum *)0x0;
    }
    else {
      std::make_shared<cmQtAutoGen::CompilerFeatures>();
      std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(genVars->ExecutableFeatures).
                  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)&err);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length);
      b = (cmAlphaNum *)0x1;
    }
  }
  bVar6 = (byte)b;
  std::__cxx11::string::~string((string *)&prop);
  if (sVar1 == 0) {
    uVar5 = (this->QtVersion).Major - 4;
    err._M_string_length = 0;
    err._M_dataplus._M_p = (pointer)0x0;
    if (uVar5 < 3) {
      err._M_string_length = (size_type)(&DAT_005cf9bc + *(int *)(&DAT_005cf9bc + (ulong)uVar5 * 4))
      ;
      err._M_dataplus._M_p = &DAT_00000005;
    }
    local_e8._8_8_ = (executable->_M_dataplus)._M_p;
    local_e8._0_8_ = executable->_M_string_length;
    cmStrCat<>(&prop,(cmAlphaNum *)&err,(cmAlphaNum *)local_e8);
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGen,&prop);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      if ((char)local_134 == '\0') {
        err._M_dataplus._M_p = (pointer)0xf;
        err._M_string_length = (size_type)anon_var_dwarf_3202f;
        local_e8._8_8_ = (executable->_M_dataplus)._M_p;
        local_e8._0_8_ = executable->_M_string_length;
        cmStrCat<char[20],std::__cxx11::string>
                  ((string *)&lfbt,(cmAlphaNum *)&err,(cmAlphaNum *)local_e8,
                   (char (*) [20])" executable target ",&prop);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,(string *)&lfbt);
        std::__cxx11::string::~string((string *)&lfbt);
        bVar6 = 0;
      }
      else {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(genVars->ExecutableFeatures).
                    super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)&err);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length);
        bVar6 = 1;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
      genVars->ExecutableTarget = this_00;
      bVar3 = cmGeneratorTarget::IsImported(this_00);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e8,"",(allocator<char> *)&lfbt);
        cmGeneratorTarget::ImportedGetLocation(&err,this_00,(string *)local_e8);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        psVar4 = (string *)local_e8;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)local_e8);
        cmGeneratorTarget::GetLocation(this_00,&err);
        std::__cxx11::string::_M_assign((string *)&genVars->Executable);
        psVar4 = &err;
      }
      std::__cxx11::string::~string((string *)psVar4);
    }
    std::__cxx11::string::~string((string *)&prop);
    if (this_00 != (cmGeneratorTarget *)0x0) {
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)local_e8,(string *)this->GlobalInitializer,
                 executable,&genVars->Executable);
      std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(genVars->ExecutableFeatures).
                  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)local_e8
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
      peVar2 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&err);
        bVar6 = 0;
      }
      std::__cxx11::string::~string((string *)&err);
      bVar6 = bVar6 | peVar2 != (element_type *)0x0;
    }
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    cmSystemTools::Error(cmStrCat(genVars.GenNameUpper, " for target ",
                                  this->GenTarget->GetName(), ": ", err));
  };

  // Custom executable
  {
    std::string const prop = cmStrCat(genVars.GenNameUpper, "_EXECUTABLE");
    std::string const& val = this->GenTarget->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable = cge->Evaluate(this->LocalGen, "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    cm::string_view prefix;
    if (this->QtVersion.Major == 4) {
      prefix = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      prefix = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      prefix = "Qt6::";
    }
    std::string const targetName = cmStrCat(prefix, executable);

    // Find target
    cmGeneratorTarget* genTarget =
      this->LocalGen->FindGeneratorTargetToUse(targetName);
    if (genTarget) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = genTarget;
      if (genTarget->IsImported()) {
        genVars.Executable = genTarget->ImportedGetLocation("");
      } else {
        genVars.Executable = genTarget->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      print_err(cmStrCat("Could not find ", executable, " executable target ",
                         targetName));
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}